

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int __thiscall userinfo_t::PlayerClassChanged(userinfo_t *this,char *classname)

{
  int intval;
  FBaseCVar **ppFVar1;
  FName local_20;
  int local_1c;
  char *pcStack_18;
  int classnum;
  char *classname_local;
  userinfo_t *this_local;
  
  pcStack_18 = classname;
  classname_local = (char *)this;
  intval = D_PlayerClassToInt(classname);
  local_1c = intval;
  FName::FName(&local_20,NAME_PlayerClass);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_20);
  FIntCVar::operator=((FIntCVar *)*ppFVar1,intval);
  return local_1c;
}

Assistant:

int userinfo_t::PlayerClassChanged(const char *classname)
{
	int classnum = D_PlayerClassToInt(classname);
	*static_cast<FIntCVar *>((*this)[NAME_PlayerClass]) = classnum;
	return classnum;
}